

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O3

bool __thiscall raft_functional_common::TestSm::apply_snapshot(TestSm *this,snapshot *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  ptr<buffer> snp_buf;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  buffer *local_28;
  element_type *local_20;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->lastSnapshotLock);
  if (iVar3 == 0) {
    nuraft::snapshot::serialize((snapshot *)&stack0xffffffffffffffd8);
    nuraft::snapshot::deserialize((snapshot *)&local_38,local_28);
    p_Var2 = p_Stack_30;
    peVar1 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->lastSnapshot).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->lastSnapshot).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->lastSnapshot).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
    }
    if (local_20 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lastSnapshotLock);
    return true;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool apply_snapshot(snapshot& s) {
        std::lock_guard<std::mutex> ll(lastSnapshotLock);
        // NOTE: We only handle logical snapshot.
        ptr<buffer> snp_buf = s.serialize();
        lastSnapshot = snapshot::deserialize(*snp_buf);
        return true;
    }